

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database_query_tests.cpp
# Opt level: O0

void __thiscall
QueryTests_Update_canDetermineSpecificationForUpdate_Test::
~QueryTests_Update_canDetermineSpecificationForUpdate_Test
          (QueryTests_Update_canDetermineSpecificationForUpdate_Test *this)

{
  QueryTests_Update_canDetermineSpecificationForUpdate_Test *this_local;
  
  ~QueryTests_Update_canDetermineSpecificationForUpdate_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(QueryTests_Update,canDetermineSpecificationForUpdate)
{
  database::Query query_update1 = "update company.employee set employee_name = Tim,employee_status = fulltime where employee_id = 1";
  ASSERT_TRUE(query_update1.transactionType() == database::update);
  ASSERT_TRUE(query_update1.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_update1.databaseName() == "company");
  ASSERT_TRUE(query_update1.containerName() == "employee");

  database::api_insert_update_type update_data1 = {
    {"employee_name","Tim"},
    {"employee_status","fulltime"}
  };
  database::api_filter_type filter1 = {
    {"employee_id",{{"1",database::equal_to}}}
  };
  ASSERT_TRUE(query_update1.values() == update_data1);
  ASSERT_TRUE(query_update1.filter() == filter1);

  database::Query query_update2 = "update company.employee set employee_status = fulltime where where employee_join_date >= 20180301 and employee_join_date <= 20190101 and employee_status = parttime";
  ASSERT_TRUE(query_update2.transactionType() == database::update);
  ASSERT_TRUE(query_update2.transactionMetaType() == database::dml);
  ASSERT_TRUE(query_update2.databaseName() == "company");
  ASSERT_TRUE(query_update2.containerName() == "employee");
  database::api_insert_update_type update_data2 = {
    {"employee_status","fulltime"}
  };
  database::api_filter_type filter2 = {
    {"employee_join_date",{{"20180301",database::greater_or_equal_to},{"20190101",database::lesser_or_equal_to}}},
    {"employee_status",{{"parttime",database::equal_to}}}
  };
  ASSERT_TRUE(query_update2.values() == update_data2);
  ASSERT_TRUE(query_update2.filter() == filter2);
}